

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

int EvpathWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *pvVar6;
  char *pcVar7;
  int iVar8;
  
  if (*Handle_v != -1) {
    (*Svcs->verbose)(*(void **)((long)Handle_v + 0x10),5,
                     "Waiting for completion of memory read to rank %d, condition %d\n",
                     (ulong)*(uint *)((long)Handle_v + 0x2c));
  }
  if (*Handle_v != -1) {
    CMCondition_wait(*(undefined8 *)((long)Handle_v + 8));
  }
  if (*(int *)((long)Handle_v + 0x28) == 0) {
    uVar2 = *Handle_v;
    iVar8 = 1;
    if (uVar2 == 0xffffffff) goto LAB_0010ae48;
    pvVar6 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    pcVar7 = "Remote memory read to rank %d with condition %d has completed\n";
  }
  else {
    pvVar6 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    uVar2 = *Handle_v;
    pcVar7 = 
    "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n";
    iVar8 = 0;
  }
  (*Svcs->verbose)(pvVar6,5,pcVar7,(ulong)uVar1,(ulong)uVar2);
LAB_0010ae48:
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)Handle_v + 0x18) + 0x18));
  lVar3 = *(long *)((long)Handle_v + 0x18);
  pvVar6 = *(void **)(lVar3 + 0x58);
  if (*(void **)(lVar3 + 0x58) == Handle_v) {
    puVar4 = (undefined8 *)(lVar3 + 0x58);
    pvVar6 = Handle_v;
  }
  else {
    do {
      pvVar5 = pvVar6;
      if (pvVar5 == (void *)0x0) goto LAB_0010ae87;
      pvVar6 = *(void **)((long)pvVar5 + 0x40);
    } while (pvVar6 != Handle_v);
    puVar4 = (undefined8 *)((long)pvVar5 + 0x40);
  }
  *puVar4 = *(undefined8 *)((long)pvVar6 + 0x40);
LAB_0010ae87:
  pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 0x18));
  free(Handle_v);
  return iVar8;
}

Assistant:

static int EvpathWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    EvpathCompletionHandle Handle = (EvpathCompletionHandle)Handle_v;
    int Ret = 1;
    if (Handle->CMcondition != -1)
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Waiting for completion of memory read to rank %d, condition %d\n",
                      Handle->Rank, Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    if (Handle->CMcondition != -1)
        CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (Handle->Failed)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
        Ret = 0;
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    pthread_mutex_lock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    RemoveRequestFromList(Svcs, Handle->DPStream, Handle);
    pthread_mutex_unlock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    free(Handle);
    return Ret;
}